

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::flagAcceptingStates(RBBITableBuilder *this)

{
  uint uVar1;
  int32_t iVar2;
  uint uVar3;
  void *obj;
  void *pvVar4;
  int index;
  int index_00;
  UVector endMarkerNodes;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::UVector(&endMarkerNodes,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      RBBINode::findNodes(*this->fTree,&endMarkerNodes,endMark,this->fStatus);
      if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        for (index = 0; index < endMarkerNodes.count; index = index + 1) {
          obj = UVector::elementAt(&endMarkerNodes,index);
          for (index_00 = 0; index_00 < this->fDStates->count; index_00 = index_00 + 1) {
            pvVar4 = UVector::elementAt(this->fDStates,index_00);
            iVar2 = UVector::indexOf(*(UVector **)((long)pvVar4 + 0x20),obj,0);
            if (-1 < iVar2) {
              uVar3 = *(uint *)((long)pvVar4 + 4);
              if (uVar3 == 0) {
                uVar3 = -(uint)(*(uint *)((long)obj + 0x7c) == 0) | *(uint *)((long)obj + 0x7c);
                *(uint *)((long)pvVar4 + 4) = uVar3;
              }
              if (uVar3 == 0xffffffff) {
                uVar1 = *(uint *)((long)obj + 0x7c);
                uVar3 = 0xffffffff;
                if (uVar1 != 0) {
                  *(uint *)((long)pvVar4 + 4) = uVar1;
                  uVar3 = uVar1;
                }
              }
              if (*(char *)((long)obj + 0x80) != '\0') {
                *(uint *)((long)pvVar4 + 8) = uVar3;
              }
            }
          }
        }
      }
    }
    UVector::~UVector(&endMarkerNodes);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagAcceptingStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     endMarkerNodes(*fStatus);
    RBBINode    *endMarker;
    int32_t     i;
    int32_t     n;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    fTree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    for (i=0; i<endMarkerNodes.size(); i++) {
        endMarker = (RBBINode *)endMarkerNodes.elementAt(i);
        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(endMarker) >= 0) {
                // Any non-zero value for fAccepting means this is an accepting node.
                // The value is what will be returned to the user as the break status.
                // If no other value was specified, force it to -1.

                if (sd->fAccepting==0) {
                    // State hasn't been marked as accepting yet.  Do it now.
                    sd->fAccepting = endMarker->fVal;
                    if (sd->fAccepting == 0) {
                        sd->fAccepting = -1;
                    }
                }
                if (sd->fAccepting==-1 && endMarker->fVal != 0) {
                    // Both lookahead and non-lookahead accepting for this state.
                    // Favor the look-ahead.  Expedient for line break.
                    // TODO:  need a more elegant resolution for conflicting rules.
                    sd->fAccepting = endMarker->fVal;
                }
                // implicit else:
                // if sd->fAccepting already had a value other than 0 or -1, leave it be.

                // If the end marker node is from a look-ahead rule, set
                //   the fLookAhead field for this state also.
                if (endMarker->fLookAheadEnd) {
                    // TODO:  don't change value if already set?
                    // TODO:  allow for more than one active look-ahead rule in engine.
                    //        Make value here an index to a side array in engine?
                    sd->fLookAhead = sd->fAccepting;
                }
            }
        }
    }
}